

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

int Abc_TtIsUnate(word *t,int nVars)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  word *tLimit;
  ulong uVar10;
  word *pwVar11;
  word *pwVar12;
  
  if (nVars < 1) {
    return 1;
  }
  iVar2 = nVars + -6;
  uVar8 = 1 << ((byte)iVar2 & 0x1f);
  uVar1 = uVar8;
  if ((int)uVar8 < 2) {
    uVar1 = 1;
  }
  uVar5 = 0;
LAB_008140b4:
  bVar3 = (byte)uVar5;
  if ((uint)nVars < 7) {
    uVar10 = *t;
    bVar3 = (byte)(1 << (bVar3 & 0x1f));
    if (((~(uVar10 << (bVar3 & 0x3f)) & s_Truths6[uVar5] & uVar10) != 0) &&
       ((~(uVar10 >> (bVar3 & 0x3f)) & s_Truths6Neg[uVar5] & uVar10) != 0)) {
      return 0;
    }
  }
  else if (uVar5 < 6) {
    if (iVar2 != 0x1f) {
      uVar10 = 0;
      do {
        if ((~(t[uVar10] << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f)) & s_Truths6[uVar5] & t[uVar10]) !=
            0) goto LAB_008141b2;
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
    }
  }
  else if (iVar2 != 0x1f) {
    bVar4 = (byte)(uVar5 - 6);
    uVar9 = 1 << (bVar4 & 0x1f);
    iVar6 = 2 << (bVar4 & 0x1f);
    uVar10 = 1;
    if (1 < (int)uVar9) {
      uVar10 = (ulong)uVar9;
    }
    pwVar11 = t + (int)uVar9;
    pwVar12 = t;
    do {
      if (uVar5 - 6 != 0x1f) {
        uVar7 = 0;
        do {
          if ((pwVar11[uVar7] & ~pwVar12[uVar7]) != 0) goto LAB_008141b2;
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      pwVar12 = pwVar12 + iVar6;
      pwVar11 = pwVar11 + iVar6;
    } while (pwVar12 < t + (int)uVar8);
  }
  goto LAB_008141fd;
LAB_008141b2:
  if (uVar5 < 6) {
    if (iVar2 != 0x1f) {
      uVar10 = 0;
      do {
        if ((~(t[uVar10] >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f)) & s_Truths6Neg[uVar5] & t[uVar10])
            != 0) {
          return 0;
        }
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
    }
  }
  else if (iVar2 != 0x1f) {
    bVar3 = (byte)(uVar5 - 6);
    uVar9 = 1 << (bVar3 & 0x1f);
    iVar6 = 2 << (bVar3 & 0x1f);
    uVar10 = 1;
    if (1 < (int)uVar9) {
      uVar10 = (ulong)uVar9;
    }
    pwVar11 = t + (int)uVar9;
    pwVar12 = t;
    do {
      if (uVar5 - 6 != 0x1f) {
        uVar7 = 0;
        do {
          if ((pwVar12[uVar7] & ~pwVar11[uVar7]) != 0) {
            return 0;
          }
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      pwVar12 = pwVar12 + iVar6;
      pwVar11 = pwVar11 + iVar6;
    } while (pwVar12 < t + (int)uVar8);
  }
LAB_008141fd:
  uVar5 = uVar5 + 1;
  if (uVar5 == (uint)nVars) {
    return 1;
  }
  goto LAB_008140b4;
}

Assistant:

static inline int Abc_TtIsUnate( word * t, int nVars )
{
    int i;
    for ( i = 0; i < nVars; i++ )
        if ( !Abc_TtNegVar(t, nVars, i) && !Abc_TtPosVar(t, nVars, i) )
            return 0;
    return 1;
}